

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::SendToSyslogAndLog(LogMessage *this)

{
  char *__ident;
  long in_RDI;
  int SEVERITY_TO_LEVEL [4];
  LogMessage *in_stack_00000060;
  uint local_18 [6];
  
  if (!SendToSyslogAndLog::openlog_already_called) {
    __ident = glog_internal_namespace_::ProgramInvocationShortName();
    openlog(__ident,0xb,8);
    SendToSyslogAndLog::openlog_already_called = true;
  }
  local_18[0] = 6;
  local_18[1] = 4;
  local_18[2] = 3;
  local_18[3] = 0;
  syslog(local_18[(int)*(char *)(*(long *)(in_RDI + 8) + 0x7698)] | 8,"%.*s",
         *(ulong *)(*(long *)(in_RDI + 8) + 0x7710) & 0xffffffff,
         *(long *)(in_RDI + 8) + 4 + *(long *)(*(long *)(in_RDI + 8) + 0x7700));
  SendToLog(in_stack_00000060);
  return;
}

Assistant:

void LogMessage::SendToSyslogAndLog() {
#ifdef HAVE_SYSLOG_H
  // Before any calls to syslog(), make a single call to openlog()
  static bool openlog_already_called = false;
  if (!openlog_already_called) {
    openlog(glog_internal_namespace_::ProgramInvocationShortName(),
            LOG_CONS | LOG_NDELAY | LOG_PID,
            LOG_USER);
    openlog_already_called = true;
  }

  // This array maps Google severity levels to syslog levels
  const int SEVERITY_TO_LEVEL[] = { LOG_INFO, LOG_WARNING, LOG_ERR, LOG_EMERG };
  syslog(LOG_USER | SEVERITY_TO_LEVEL[static_cast<int>(data_->severity_)], "%.*s",
         int(data_->num_chars_to_syslog_),
         data_->message_text_ + data_->num_prefix_chars_);
  SendToLog();
#else
  LOG(ERROR) << "No syslog support: message=" << data_->message_text_;
#endif
}